

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu_matrix.c
# Opt level: O1

void GPU_MatrixOrtho(float *result,float left,float right,float bottom,float top,float z_near,
                    float z_far)

{
  float temp [16];
  float local_98 [6];
  undefined8 local_80;
  undefined8 uStack_78;
  float local_70;
  undefined4 local_6c;
  float local_68;
  float local_64;
  float local_60;
  undefined4 local_5c;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  
  if (result != (float *)0x0) {
    local_98[0] = 2.0 / (right - left);
    local_98[5] = 2.0 / (top - bottom);
    local_98[1] = 0.0;
    local_98[2] = 0.0;
    local_98[3] = 0.0;
    local_98[4] = 0.0;
    local_70 = -2.0 / (z_far - z_near);
    local_80 = 0;
    uStack_78 = 0;
    local_6c = 0;
    local_68 = -(left + right) / (right - left);
    local_64 = -(bottom + top) / (top - bottom);
    local_60 = -(z_near + z_far) / (z_far - z_near);
    local_5c = 0x3f800000;
    GPU_MatrixMultiply((float *)&local_58,result,local_98);
    *(undefined8 *)(result + 0xc) = local_28;
    *(undefined8 *)(result + 0xe) = uStack_20;
    *(undefined8 *)(result + 8) = local_38;
    *(undefined8 *)(result + 10) = uStack_30;
    *(undefined8 *)(result + 4) = local_48;
    *(undefined8 *)(result + 6) = uStack_40;
    *(undefined8 *)result = local_58;
    *(undefined8 *)(result + 2) = uStack_50;
  }
  return;
}

Assistant:

void GPU_MatrixOrtho(float* result, float left, float right, float bottom, float top, float z_near, float z_far)
{
    if(result == NULL)
		return;

	{
#ifdef ROW_MAJOR
		float A[16];
		FILL_MATRIX_4x4(A,
				2/(right - left), 0,  0, -(right + left)/(right - left),
				0, 2/(top - bottom), 0, -(top + bottom)/(top - bottom),
				0, 0, -2/(z_far - z_near), -(z_far + z_near)/(z_far - z_near),
				0, 0, 0, 1
			);
#else
		float A[16];
		FILL_MATRIX_4x4(A,
				2 / (right - left), 0, 0, 0,
				0, 2 / (top - bottom), 0, 0,
				0, 0, -2 / (z_far - z_near), 0,
				-(right + left) / (right - left), -(top + bottom) / (top - bottom), -(z_far + z_near) / (z_far - z_near), 1
			);
#endif

		GPU_MultiplyAndAssign(result, A);
	}
}